

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

string * google::protobuf::compiler::php::EnumOrMessageSuffix_abi_cxx11_
                   (FieldDescriptor *field,bool is_descriptor)

{
  CppType CVar1;
  byte in_DL;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  allocator local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88 [48];
  string local_58 [15];
  undefined1 in_stack_ffffffffffffffb7;
  undefined8 in_stack_ffffffffffffffb8;
  string local_38 [39];
  byte local_11;
  
  local_11 = in_DL & 1;
  CVar1 = FieldDescriptor::cpp_type((FieldDescriptor *)0x4a4acc);
  if (CVar1 == CPPTYPE_MESSAGE) {
    FieldDescriptor::message_type((FieldDescriptor *)in_stack_ffffffffffffff30);
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58;
    DescriptorFullName<google::protobuf::Descriptor>
              ((Descriptor *)in_stack_ffffffffffffffb8,(bool)in_stack_ffffffffffffffb7);
    std::operator+((char *)pbVar2,in_stack_ffffffffffffff30);
    std::operator+(pbVar2,(char *)in_stack_ffffffffffffff30);
    std::__cxx11::string::~string(local_38);
    std::__cxx11::string::~string(local_58);
  }
  else {
    CVar1 = FieldDescriptor::cpp_type((FieldDescriptor *)0x4a4ba1);
    if (CVar1 == CPPTYPE_ENUM) {
      FieldDescriptor::enum_type((FieldDescriptor *)in_stack_ffffffffffffff30);
      pbVar2 = &local_a8;
      DescriptorFullName<google::protobuf::EnumDescriptor>
                ((EnumDescriptor *)in_stack_ffffffffffffffb8,(bool)in_stack_ffffffffffffffb7);
      std::operator+((char *)in_stack_ffffffffffffff38,pbVar2);
      std::operator+(in_stack_ffffffffffffff38,(char *)pbVar2);
      std::__cxx11::string::~string(local_88);
      std::__cxx11::string::~string((string *)&local_a8);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"",&local_a9);
      std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    }
  }
  return in_RDI;
}

Assistant:

std::string EnumOrMessageSuffix(
    const FieldDescriptor* field, bool is_descriptor) {
  if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
    return ", '" + DescriptorFullName(field->message_type(), is_descriptor) + "'";
  }
  if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
    return ", '" + DescriptorFullName(field->enum_type(), is_descriptor) + "'";
  }
  return "";
}